

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O1

string * cmStrCat<char[13],std::__cxx11::string,char[3]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [13],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [3])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_t local_68;
  char *pcStack_60;
  size_t local_58;
  char (*local_50) [13];
  size_type local_48;
  pointer local_40;
  size_t local_38;
  char (*local_30) [3];
  
  local_78._M_len = (a->View_)._M_len;
  local_78._M_str = (a->View_)._M_str;
  local_68 = (b->View_)._M_len;
  pcStack_60 = (b->View_)._M_str;
  local_58 = strlen(*args);
  local_40 = (args_1->_M_dataplus)._M_p;
  local_48 = args_1->_M_string_length;
  local_50 = args;
  local_38 = strlen(*args_2);
  views._M_len = 5;
  views._M_array = &local_78;
  local_30 = args_2;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}